

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O3

uint anon_unknown.dwarf_55c6a2::countMipmaps(int w,int h,int d)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar2 = 1;
  if (d != 1 || (h != 1 || w != 1)) {
    do {
      iVar3 = d;
      iVar4 = h;
      iVar5 = w / 2;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      h = iVar4 / 2;
      if (h < 2) {
        h = 1;
      }
      d = iVar3 / 2;
      if (d < 2) {
        d = 1;
      }
      uVar2 = uVar2 + 1;
      bVar1 = 3 < w;
      w = iVar5;
    } while (((bVar1) || (3 < iVar4)) || (3 < iVar3));
  }
  return uVar2;
}

Assistant:

static uint countMipmaps(int w, int h, int d)
	{
		uint mipmap = 0;
		
		while (w != 1 || h != 1 || d != 1) {
			w = max(1, w / 2);
			h = max(1, h / 2);
			d = max(1, d / 2);
			mipmap++;
		}
		
		return mipmap + 1;
	}